

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  char *pcVar1;
  ImFont **ppIVar2;
  ImFont *pIVar3;
  ImFontConfig *pIVar4;
  ImFontAtlasCustomRect *ptr;
  int iVar5;
  ImFontConfig *pIVar6;
  long lVar7;
  long lVar8;
  
  iVar5 = (this->ConfigData).Size;
  if (0 < iVar5) {
    pIVar6 = (this->ConfigData).Data;
    lVar7 = 0;
    lVar8 = 0;
    do {
      if ((*(void **)(pIVar6->Name + lVar7 + -0x56) != (void *)0x0) &&
         (pIVar6->Name[lVar7 + -0x4a] == '\x01')) {
        ImGui::MemFree(*(void **)(pIVar6->Name + lVar7 + -0x56));
        pIVar6 = (this->ConfigData).Data;
        pcVar1 = pIVar6->Name + lVar7 + -0x56;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        iVar5 = (this->ConfigData).Size;
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x88;
    } while (lVar8 < iVar5);
  }
  lVar7 = (long)(this->Fonts).Size;
  if (lVar7 < 1) {
    pIVar6 = (this->ConfigData).Data;
  }
  else {
    ppIVar2 = (this->Fonts).Data;
    pIVar6 = (this->ConfigData).Data;
    lVar8 = 0;
    do {
      pIVar3 = ppIVar2[lVar8];
      pIVar4 = pIVar3->ConfigData;
      if ((pIVar6 <= pIVar4) && (pIVar4 < pIVar6 + iVar5)) {
        pIVar3->ConfigData = (ImFontConfig *)0x0;
        ppIVar2[lVar8]->ConfigDataCount = 0;
      }
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  if (pIVar6 != (ImFontConfig *)0x0) {
    (this->ConfigData).Size = 0;
    (this->ConfigData).Capacity = 0;
    ImGui::MemFree(pIVar6);
    (this->ConfigData).Data = (ImFontConfig *)0x0;
  }
  ptr = (this->CustomRects).Data;
  if (ptr != (ImFontAtlasCustomRect *)0x0) {
    (this->CustomRects).Size = 0;
    (this->CustomRects).Capacity = 0;
    ImGui::MemFree(ptr);
    (this->CustomRects).Data = (ImFontAtlasCustomRect *)0x0;
  }
  this->PackIdMouseCursors = -1;
  this->PackIdLines = -1;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
    // Important: we leave TexReady untouched
}